

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

void __thiscall
density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>::
reentrant_emplace<unsigned_int,unsigned_int&>
          (heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
           *this,uint *i_construction_params)

{
  reentrant_put_transaction<unsigned_int> local_20;
  
  start_reentrant_emplace<unsigned_int,unsigned_int&>(&local_20,this,i_construction_params);
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
  reentrant_put_transaction<unsigned_int>::commit(&local_20);
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
  reentrant_put_transaction<unsigned_int>::~reentrant_put_transaction(&local_20);
  return;
}

Assistant:

void reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)
              .commit();
        }